

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracy_concurrentqueue.h
# Opt level: O3

Block * __thiscall
tracy::moodycamel::
ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block(ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  *this)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict1 _Var3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Block *pBVar7;
  __pointer_type pBVar8;
  __pointer_type pBVar9;
  Block *pBVar10;
  bool bVar11;
  
  uVar6 = this->initialBlockPoolSize;
  if ((this->initialBlockPoolIndex).super___atomic_base<unsigned_long>._M_i < uVar6) {
    LOCK();
    paVar1 = &this->initialBlockPoolIndex;
    uVar4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (this->initialBlockPool != (Block *)0x0 && uVar4 < uVar6) {
      return this->initialBlockPool + uVar4;
    }
  }
  pBVar10 = (this->freeList).freeListHead._M_b._M_p;
joined_r0x002fc754:
  do {
    pBVar7 = pBVar10;
    if (pBVar7 == (Block *)0x0) {
      InitRpmalloc();
      pBVar10 = (Block *)rpmalloc(0x200030);
      (pBVar10->freeListRefs).super___atomic_base<unsigned_int>._M_i = 0;
      (pBVar10->freeListNext)._M_b._M_p = (__pointer_type)0x0;
      pBVar10->shouldBeOnFreeList = (__atomic_base<bool>)0x0;
      pBVar10->dynamicallyAllocated = true;
      pBVar10->next = (Block *)0x0;
      (pBVar10->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
      return pBVar10;
    }
    uVar5 = (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if ((uVar5 & 0x7fffffff) == 0) {
LAB_002fc7db:
      pBVar10 = (this->freeList).freeListHead._M_b._M_p;
      goto joined_r0x002fc754;
    }
    LOCK();
    bVar11 = uVar5 == (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if (bVar11) {
      (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar5 + 1;
    }
    UNLOCK();
    if (!bVar11) goto LAB_002fc7db;
    LOCK();
    pBVar10 = (this->freeList).freeListHead._M_b._M_p;
    bVar11 = pBVar7 == pBVar10;
    if (bVar11) {
      (this->freeList).freeListHead._M_b._M_p = (pBVar7->freeListNext)._M_b._M_p;
      pBVar10 = pBVar7;
    }
    UNLOCK();
    if (bVar11) {
      if (-1 < (int)(pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i) {
        LOCK();
        (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i =
             (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
        UNLOCK();
        return pBVar7;
      }
      __assert_fail("(head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/tracy_concurrentqueue.h"
                    ,699,
                    "N *tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::FreeList<tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::Block>::try_get() [T = tracy::QueueItem, Traits = tracy::moodycamel::ConcurrentQueueDefaultTraits, N = tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::Block]"
                   );
    }
    LOCK();
    paVar2 = &pBVar7->freeListRefs;
    _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if (_Var3 == 0x80000001) {
      pBVar8 = (this->freeList).freeListHead._M_b._M_p;
      do {
        (pBVar7->freeListNext)._M_b._M_p = pBVar8;
        (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
        LOCK();
        pBVar9 = (this->freeList).freeListHead._M_b._M_p;
        bVar11 = pBVar8 == pBVar9;
        if (bVar11) {
          (this->freeList).freeListHead._M_b._M_p = pBVar7;
          pBVar9 = pBVar8;
        }
        UNLOCK();
        if (bVar11) break;
        LOCK();
        paVar2 = &pBVar7->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
        UNLOCK();
        pBVar8 = pBVar9;
      } while (_Var3 == 1);
    }
  } while( true );
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}

		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}

		return create<Block>();
	}